

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

void set_chroma_coefficient_fallback_soln(aom_equation_system_t *eqns)

{
  int iVar1;
  long lVar2;
  
  iVar1 = eqns->n;
  lVar2 = (long)iVar1;
  memset(eqns->x,0,lVar2 * 8);
  if (1e-06 < ABS(eqns->A[(eqns->n + 1) * (iVar1 + -1)])) {
    eqns->x[lVar2 + -1] = eqns->b[lVar2 + -1] / eqns->A[(eqns->n + 1) * (iVar1 + -1)];
  }
  return;
}

Assistant:

static void set_chroma_coefficient_fallback_soln(aom_equation_system_t *eqns) {
  const double kTolerance = 1e-6;
  const int last = eqns->n - 1;
  // Set all of the AR coefficients to zero, but try to solve for correlation
  // with the luma channel
  memset(eqns->x, 0, sizeof(*eqns->x) * eqns->n);
  if (fabs(eqns->A[last * eqns->n + last]) > kTolerance) {
    eqns->x[last] = eqns->b[last] / eqns->A[last * eqns->n + last];
  }
}